

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

void __thiscall internalJSONNode::Set(internalJSONNode *this,json_string *val)

{
  this->_type = '\x01';
  std::__cxx11::string::_M_assign((string *)&this->_string);
  this->_string_encoded = true;
  this->fetched = true;
  return;
}

Assistant:

void internalJSONNode::Set(const json_string & val) json_nothrow {
    makeNotContainer();
    _type = JSON_STRING;
    _string = val;
	shrinkString(_string);
    _string_encoded = true;
    SetFetched(true);
}